

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool createNativeWindow(_GLFWwindow *window,_GLFWwndconfig *wndconfig,Visual *visual,int depth)

{
  Colormap CVar1;
  Window WVar2;
  size_t sVar3;
  XIC p_Var4;
  int iVar5;
  undefined8 in_stack_fffffffffffffeb8;
  uint uVar6;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 uVar7;
  void *local_118;
  undefined8 local_110;
  Atom version;
  XClassHint *hint;
  XWMHints *hints;
  Atom type;
  Atom AStack_e8;
  pid_t pid;
  Atom protocols [2];
  uint local_cc;
  Atom local_c8;
  int count;
  Atom states [3];
  Window parent;
  unsigned_long wamask;
  XSetWindowAttributes wa;
  int depth_local;
  Visual *visual_local;
  _GLFWwndconfig *wndconfig_local;
  _GLFWwindow *window_local;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  uVar6 = (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  wa.cursor._4_4_ = depth;
  CVar1 = XCreateColormap(_glfw.x11.display,_glfw.x11.root,visual,0);
  (window->x11).colormap = CVar1;
  wa._88_8_ = (window->x11).colormap;
  wa.border_pixmap = 0;
  wa.save_under = 0x63807f;
  wa._68_4_ = 0;
  _glfwGrabErrorHandlerX11();
  if (wndconfig->nativeParent == (void *)0x0) {
    local_118 = (void *)_glfw.x11.root;
  }
  else {
    local_118 = wndconfig->nativeParent;
  }
  states[2] = (Atom)local_118;
  WVar2 = XCreateWindow(_glfw.x11.display,local_118,0,0,wndconfig->width,wndconfig->height,
                        (ulong)uVar6 << 0x20,CONCAT44(uVar7,wa.cursor._4_4_),1,visual,0x2808,&wamask
                       );
  (window->x11).handle = WVar2;
  _glfwReleaseErrorHandlerX11();
  if ((window->x11).handle == 0) {
    _glfwInputErrorX11(0x10008,"X11: Failed to create window");
    window_local._4_4_ = 0;
  }
  else {
    XSaveContext(_glfw.x11.display,(window->x11).handle,_glfw.x11.context,window);
    if (wndconfig->decorated == 0) {
      _glfwPlatformSetWindowDecorated(window,0);
    }
    if ((_glfw.x11.NET_WM_STATE != 0) && (window->monitor == (_GLFWmonitor *)0x0)) {
      local_cc = 0;
      if (wndconfig->floating != 0) {
        if (_glfw.x11.NET_WM_STATE_ABOVE != 0) {
          local_c8 = _glfw.x11.NET_WM_STATE_ABOVE;
        }
        local_cc = (uint)(_glfw.x11.NET_WM_STATE_ABOVE != 0);
      }
      if (((wndconfig->maximized != 0) && (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0)) &&
         (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0)) {
        iVar5 = local_cc + 1;
        *(Atom *)((long)&stack0xffffffffffffff38 + (long)(int)local_cc * 8) =
             _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        local_cc = local_cc + 2;
        *(Atom *)((long)&stack0xffffffffffffff38 + (long)iVar5 * 8) =
             _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        (window->x11).maximized = 1;
      }
      if (local_cc != 0) {
        XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_STATE,4,0x20,0,
                        &stack0xffffffffffffff38,local_cc);
      }
    }
    AStack_e8 = _glfw.x11.WM_DELETE_WINDOW;
    protocols[0] = _glfw.x11.NET_WM_PING;
    XSetWMProtocols(_glfw.x11.display,(window->x11).handle,&stack0xffffffffffffff18,2);
    type._4_4_ = getpid();
    XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_PID,6,0x20,0,
                    (long)&type + 4,1);
    if ((_glfw.x11.NET_WM_WINDOW_TYPE != 0) && (_glfw.x11.NET_WM_WINDOW_TYPE_NORMAL != 0)) {
      hints = (XWMHints *)_glfw.x11.NET_WM_WINDOW_TYPE_NORMAL;
      XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_WINDOW_TYPE,4,0x20,0,
                      &hints,1);
    }
    hint = (XClassHint *)XAllocWMHints();
    if (hint == (XClassHint *)0x0) {
      _glfwInputError(0x10005,"X11: Failed to allocate WM hints");
      window_local._4_4_ = 0;
    }
    else {
      hint->res_name = (char *)0x2;
      *(undefined4 *)((long)&hint->res_class + 4) = 1;
      XSetWMHints(_glfw.x11.display,(window->x11).handle,hint);
      XFree(hint);
      updateNormalHints(window,wndconfig->width,wndconfig->height);
      sVar3 = strlen(wndconfig->title);
      if (sVar3 != 0) {
        version = XAllocClassHint();
        *(char **)version = wndconfig->title;
        *(char **)(version + 8) = wndconfig->title;
        XSetClassHint(_glfw.x11.display,(window->x11).handle,version);
        XFree(version);
      }
      if (_glfw.x11.XdndAware != 0) {
        local_110 = 5;
        XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.XdndAware,4,0x20,0,
                        &local_110,1);
      }
      _glfwPlatformSetWindowTitle(window,wndconfig->title);
      if (_glfw.x11.im != (XIM)0x0) {
        p_Var4 = (XIC)XCreateIC(_glfw.x11.im,"inputStyle",0x408,"clientWindow",(window->x11).handle,
                                "focusWindow",(window->x11).handle,0);
        (window->x11).ic = p_Var4;
      }
      _glfwPlatformGetWindowPos(window,&(window->x11).xpos,&(window->x11).ypos);
      _glfwPlatformGetWindowSize(window,&(window->x11).width,&(window->x11).height);
      window_local._4_4_ = 1;
    }
  }
  return window_local._4_4_;
}

Assistant:

static GLFWbool createNativeWindow(_GLFWwindow* window,
                                   const _GLFWwndconfig* wndconfig,
                                   Visual* visual, int depth)
{
    // Create a colormap based on the visual used by the current context
    window->x11.colormap = XCreateColormap(_glfw.x11.display,
                                           _glfw.x11.root,
                                           visual,
                                           AllocNone);

    // Create the actual window
    {
        XSetWindowAttributes wa;
        const unsigned long wamask = CWBorderPixel | CWColormap | CWEventMask;

        wa.colormap = window->x11.colormap;
        wa.border_pixel = 0;
        wa.event_mask = StructureNotifyMask | KeyPressMask | KeyReleaseMask |
                        PointerMotionMask | ButtonPressMask | ButtonReleaseMask |
                        ExposureMask | FocusChangeMask | VisibilityChangeMask |
                        EnterWindowMask | LeaveWindowMask | PropertyChangeMask;

        _glfwGrabErrorHandlerX11();

        const Window parent = (wndconfig->nativeParent
                               ? (Window)wndconfig->nativeParent
                               : _glfw.x11.root);

        window->x11.handle = XCreateWindow(_glfw.x11.display,
                                           parent,
                                           0, 0,
                                           wndconfig->width, wndconfig->height,
                                           0,      // Border width
                                           depth,  // Color depth
                                           InputOutput,
                                           visual,
                                           wamask,
                                           &wa);

        _glfwReleaseErrorHandlerX11();

        if (!window->x11.handle)
        {
            _glfwInputErrorX11(GLFW_PLATFORM_ERROR,
                               "X11: Failed to create window");
            return GLFW_FALSE;
        }

        XSaveContext(_glfw.x11.display,
                     window->x11.handle,
                     _glfw.x11.context,
                     (XPointer) window);
    }

    if (!wndconfig->decorated)
        _glfwPlatformSetWindowDecorated(window, GLFW_FALSE);

    if (_glfw.x11.NET_WM_STATE && !window->monitor)
    {
        Atom states[3];
        int count = 0;

        if (wndconfig->floating)
        {
            if (_glfw.x11.NET_WM_STATE_ABOVE)
                states[count++] = _glfw.x11.NET_WM_STATE_ABOVE;
        }

        if (wndconfig->maximized)
        {
            if (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT &&
                _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ)
            {
                states[count++] = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
                states[count++] = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
                window->x11.maximized = GLFW_TRUE;
            }
        }

        if (count)
        {
            XChangeProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_STATE, XA_ATOM, 32,
                            PropModeReplace, (unsigned char*) &states, count);
        }
    }

    // Declare the WM protocols supported by GLFW
    {
        Atom protocols[] =
        {
            _glfw.x11.WM_DELETE_WINDOW,
            _glfw.x11.NET_WM_PING
        };

        XSetWMProtocols(_glfw.x11.display, window->x11.handle,
                        protocols, sizeof(protocols) / sizeof(Atom));
    }

    // Declare our PID
    {
        const pid_t pid = getpid();

        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_PID, XA_CARDINAL, 32,
                        PropModeReplace,
                        (unsigned char*) &pid, 1);
    }

    if (_glfw.x11.NET_WM_WINDOW_TYPE && _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL)
    {
        Atom type = _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL;
        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_WINDOW_TYPE, XA_ATOM, 32,
                        PropModeReplace, (unsigned char*) &type, 1);
    }

    // Set ICCCM WM_HINTS property
    {
        XWMHints* hints = XAllocWMHints();
        if (!hints)
        {
            _glfwInputError(GLFW_OUT_OF_MEMORY,
                            "X11: Failed to allocate WM hints");
            return GLFW_FALSE;
        }

        hints->flags = StateHint;
        hints->initial_state = NormalState;

        XSetWMHints(_glfw.x11.display, window->x11.handle, hints);
        XFree(hints);
    }

    updateNormalHints(window, wndconfig->width, wndconfig->height);

    // Set ICCCM WM_CLASS property
    // HACK: Until a mechanism for specifying the application name is added, the
    //       initial window title is used as the window class name
    if (strlen(wndconfig->title))
    {
        XClassHint* hint = XAllocClassHint();
        hint->res_name = (char*) wndconfig->title;
        hint->res_class = (char*) wndconfig->title;

        XSetClassHint(_glfw.x11.display, window->x11.handle, hint);
        XFree(hint);
    }

    if (_glfw.x11.XdndAware)
    {
        // Announce support for Xdnd (drag and drop)
        const Atom version = 5;
        XChangeProperty(_glfw.x11.display, window->x11.handle,
                        _glfw.x11.XdndAware, XA_ATOM, 32,
                        PropModeReplace, (unsigned char*) &version, 1);
    }

    _glfwPlatformSetWindowTitle(window, wndconfig->title);

    if (_glfw.x11.im)
    {
        window->x11.ic = XCreateIC(_glfw.x11.im,
                                   XNInputStyle,
                                   XIMPreeditNothing | XIMStatusNothing,
                                   XNClientWindow,
                                   window->x11.handle,
                                   XNFocusWindow,
                                   window->x11.handle,
                                   NULL);
    }

    _glfwPlatformGetWindowPos(window, &window->x11.xpos, &window->x11.ypos);
    _glfwPlatformGetWindowSize(window, &window->x11.width, &window->x11.height);

    return GLFW_TRUE;
}